

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
          (ChTriangleMeshConnected *this,bool bodyCoords,double *mass,ChVector<double> *center,
          ChMatrix33<double> *inertia)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer pCVar9;
  pointer pCVar10;
  double dVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 in_ZMM19 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 in_ZMM21 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 in_ZMM22 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 in_ZMM23 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 in_ZMM24 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 in_ZMM25 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar94 [64];
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  auVar56 = in_ZMM24._0_16_;
  auVar18 = in_ZMM21._0_16_;
  auVar45 = in_ZMM23._0_16_;
  auVar23 = in_ZMM27._0_16_;
  auVar21 = in_ZMM26._0_16_;
  auVar20 = in_ZMM25._0_16_;
  auVar19 = in_ZMM22._0_16_;
  auVar17 = in_ZMM20._0_16_;
  auVar16 = in_ZMM18._0_16_;
  auVar15 = in_ZMM19._0_16_;
  iVar12 = (*(this->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry[0xd])();
  if (iVar12 < 1) {
    dVar28 = 0.0;
    auVar16 = ZEXT816(0x8000000000000000);
    dVar30 = 0.0;
    dVar36 = 0.0;
    dVar41 = 0.0;
    dVar48 = 0.0;
    dVar52 = 0.0;
    dVar39 = 0.0;
    auVar15 = auVar16;
    auVar17 = auVar16;
  }
  else {
    auVar15 = vxorpd_avx512vl(auVar15,auVar15);
    auVar78 = ZEXT1664(auVar15);
    lVar14 = 8;
    lVar13 = 0;
    auVar16 = vxorpd_avx512vl(auVar16,auVar16);
    auVar76 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar17,auVar17);
    auVar80 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar19,auVar19);
    auVar84 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar20,auVar20);
    auVar90 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar21,auVar21);
    auVar92 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar23,auVar23);
    auVar94 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar45,auVar45);
    auVar86 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar18,auVar18);
    auVar82 = ZEXT1664(auVar16);
    auVar16 = vxorpd_avx512vl(auVar56,auVar56);
    auVar88 = ZEXT1664(auVar16);
    do {
      pCVar9 = (this->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar12 = *(int *)((long)pCVar9->m_data + lVar14 + -8);
      pCVar10 = (this->m_vertices).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar28 = pCVar10[iVar12].m_data[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar28;
      dVar30 = pCVar10[iVar12].m_data[1];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar30;
      dVar36 = pCVar10[iVar12].m_data[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar36;
      iVar12 = *(int *)((long)pCVar9->m_data + lVar14 + -4);
      dVar39 = pCVar10[iVar12].m_data[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar39;
      dVar41 = pCVar10[iVar12].m_data[1];
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar41;
      dVar48 = pCVar10[iVar12].m_data[2];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar48;
      iVar12 = *(int *)((long)pCVar9->m_data + lVar14);
      dVar52 = pCVar10[iVar12].m_data[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar52;
      dVar1 = pCVar10[iVar12].m_data[1];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar1;
      dVar2 = pCVar10[iVar12].m_data[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar2;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar41 - dVar30;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = dVar2 - dVar36;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = (dVar1 - dVar30) * (dVar48 - dVar36);
      auVar15 = vfmsub231sd_fma(auVar58,auVar15,auVar56);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (dVar2 - dVar36) * (dVar39 - dVar28);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = dVar48 - dVar36;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = dVar52 - dVar28;
      auVar45 = vfmsub231sd_fma(auVar57,auVar69,auVar65);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (dVar52 - dVar28) * (dVar41 - dVar30);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar39 - dVar28;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = dVar1 - dVar30;
      auVar56 = vfmsub231sd_fma(auVar18,auVar61,auVar73);
      dVar11 = dVar28 + dVar39 + dVar52;
      auVar16 = vmulsd_avx512f(auVar21,auVar21);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = dVar28 + dVar39;
      auVar17 = vfmadd213sd_avx512f(auVar70,auVar20,auVar16);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = dVar11;
      auVar18 = vfmadd213sd_avx512f(auVar66,auVar23,auVar17);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = auVar17._0_8_ * dVar39;
      auVar16 = vfmadd231sd_avx512f(auVar74,auVar21,auVar16);
      auVar17 = vfmadd231sd_avx512f(auVar78._0_16_,auVar15,auVar66);
      vmovsd_avx512f(auVar17);
      auVar16 = vfmadd231sd_avx512f(auVar16,auVar23,auVar18);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = dVar11 + dVar28;
      auVar17 = vfmadd213sd_avx512f(auVar62,auVar21,auVar18);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar11 + dVar39;
      auVar19 = vfmadd213sd_avx512f(auVar71,auVar20,auVar18);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar11 + dVar52;
      auVar20 = vfmadd213sd_avx512f(auVar67,auVar23,auVar18);
      auVar18 = vfmadd231sd_avx512f(auVar76._0_16_,auVar15,auVar18);
      vmovsd_avx512f(auVar18);
      auVar16 = vfmadd231sd_avx512f(auVar90._0_16_,auVar15,auVar16);
      vmovsd_avx512f(auVar16);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = dVar41 * auVar19._0_8_;
      auVar16 = vfmadd231sd_fma(auVar72,auVar42,auVar17);
      auVar16 = vfmadd231sd_fma(auVar16,auVar53,auVar20);
      dVar28 = dVar41 + dVar30 + dVar1;
      auVar16 = vfmadd231sd_avx512f(auVar86._0_16_,auVar15,auVar16);
      vmovsd_avx512f(auVar16);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar30 * dVar30;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = dVar41 + dVar30;
      auVar16 = vfmadd213sd_fma(auVar63,auVar49,auVar59);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = dVar28;
      auVar15 = vfmadd213sd_fma(auVar68,auVar53,auVar16);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = dVar41 * auVar16._0_8_;
      auVar18 = vfmadd231sd_fma(auVar64,auVar42,auVar59);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar28 + dVar30;
      auVar16 = vfmadd213sd_fma(auVar60,auVar42,auVar15);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar41 + dVar28;
      auVar17 = vfmadd213sd_fma(auVar43,auVar49,auVar15);
      auVar19 = vfmadd231sd_fma(auVar18,auVar53,auVar15);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar1 + dVar28;
      auVar18 = vfmadd213sd_fma(auVar50,auVar53,auVar15);
      auVar15 = vfmadd231sd_avx512f(auVar80._0_16_,auVar45,auVar15);
      vmovsd_avx512f(auVar15);
      auVar15 = vfmadd231sd_avx512f(auVar92._0_16_,auVar45,auVar19);
      vmovsd_avx512f(auVar15);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar48 * auVar17._0_8_;
      auVar16 = vfmadd231sd_fma(auVar44,auVar25,auVar16);
      auVar16 = vfmadd231sd_fma(auVar16,auVar31,auVar18);
      dVar28 = dVar36 + dVar48 + dVar2;
      auVar16 = vfmadd231sd_avx512f(auVar82._0_16_,auVar45,auVar16);
      vmovsd_avx512f(auVar16);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar36 * dVar36;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar36 + dVar48;
      auVar16 = vfmadd213sd_fma(auVar54,auVar37,auVar45);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = dVar28;
      auVar15 = vfmadd213sd_fma(auVar51,auVar31,auVar16);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = auVar16._0_8_ * dVar48;
      auVar18 = vfmadd231sd_fma(auVar55,auVar25,auVar45);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar28 + dVar36;
      auVar16 = vfmadd213sd_fma(auVar46,auVar25,auVar15);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar28 + dVar48;
      auVar17 = vfmadd213sd_fma(auVar17,auVar37,auVar15);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar39 * auVar17._0_8_;
      auVar17 = vfmadd231sd_fma(auVar19,auVar21,auVar16);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar28 + dVar2;
      auVar16 = vfmadd213sd_fma(auVar16,auVar31,auVar15);
      auVar16 = vfmadd231sd_fma(auVar17,auVar23,auVar16);
      auVar17 = vfmadd231sd_fma(auVar18,auVar31,auVar15);
      auVar15 = vfmadd231sd_avx512f(auVar84._0_16_,auVar56,auVar15);
      vmovsd_avx512f(auVar15);
      auVar15 = vfmadd231sd_avx512f(auVar94._0_16_,auVar56,auVar17);
      vmovsd_avx512f(auVar15);
      auVar16 = vfmadd231sd_avx512f(auVar88._0_16_,auVar56,auVar16);
      vmovsd_avx512f(auVar16);
      lVar13 = lVar13 + 1;
      iVar12 = (*(this->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry[0xd])(this);
      auVar94 = ZEXT864(local_80);
      auVar92 = ZEXT864(local_78);
      auVar90 = ZEXT864(local_70);
      auVar88 = ZEXT864(local_68);
      auVar86 = ZEXT864(local_60);
      auVar84 = ZEXT864(local_58);
      auVar82 = ZEXT864(local_50);
      auVar80 = ZEXT864(local_48);
      auVar78 = ZEXT864(local_40);
      auVar76 = ZEXT864(local_38);
      lVar14 = lVar14 + 0xc;
    } while (lVar13 < iVar12);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_40;
    auVar16 = vmulsd_avx512f(auVar77,ZEXT816(0x3fc5555555555555));
    dVar39 = auVar16._0_8_;
    auVar15 = ZEXT816(0x3f91111111111111);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = local_70;
    auVar16 = vmulsd_avx512f(auVar89,auVar15);
    dVar36 = auVar16._0_8_;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = local_78;
    auVar16 = vmulsd_avx512f(auVar91,auVar15);
    dVar30 = auVar16._0_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_80;
    auVar16 = vmulsd_avx512f(auVar93,auVar15);
    dVar28 = auVar16._0_8_;
    auVar15 = ZEXT816(0x3fa5555555555555);
    auVar83._8_8_ = 0;
    auVar83._0_8_ = local_58;
    auVar16 = vmulsd_avx512f(auVar83,auVar15);
    dVar41 = auVar16._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_48;
    auVar16 = vmulsd_avx512f(auVar79,auVar15);
    dVar48 = auVar16._0_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_38;
    auVar16 = vmulsd_avx512f(auVar75,auVar15);
    dVar52 = auVar16._0_8_;
    auVar15 = ZEXT816(0xbf81111111111111);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = local_60;
    auVar17 = vmulsd_avx512f(auVar85,auVar15);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = local_68;
    auVar16 = vmulsd_avx512f(auVar87,auVar15);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = local_50;
    auVar15 = vmulsd_avx512f(auVar81,auVar15);
  }
  *mass = dVar39;
  dVar39 = 1.0 / dVar39;
  center->m_data[0] = dVar52 * dVar39;
  center->m_data[1] = dVar48 * dVar39;
  center->m_data[2] = dVar41 * dVar39;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       dVar28 + dVar30;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar17._0_8_;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar16._0_8_;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar17._0_8_;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       dVar28 + dVar36;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar15._0_8_;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar16._0_8_;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar15._0_8_;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       dVar30 + dVar36;
  if (bodyCoords) {
    auVar32._8_8_ = 0;
    auVar32._0_8_ = center->m_data[1];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = center->m_data[2] * center->m_data[2];
    auVar18 = vfmadd231sd_fma(auVar38,auVar32,auVar32);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *mass;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar28 + dVar30;
    auVar18 = vfnmadd132sd_fma(auVar18,auVar47,auVar3);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         auVar18._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = center->m_data[1];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *mass * center->m_data[0];
    auVar17 = vfmadd231sd_fma(auVar17,auVar33,auVar4);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar17._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = center->m_data[0];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *mass * center->m_data[2];
    auVar16 = vfmadd231sd_fma(auVar16,auVar34,auVar5);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar16._0_8_;
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         auVar17._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = center->m_data[2];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = center->m_data[0] * center->m_data[0];
    auVar17 = vfmadd231sd_fma(auVar26,auVar35,auVar35);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *mass;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar28 + dVar36;
    auVar17 = vfnmadd132sd_fma(auVar17,auVar40,auVar6);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar17._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = center->m_data[2];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *mass * center->m_data[1];
    auVar15 = vfmadd231sd_fma(auVar15,auVar27,auVar7);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar15._0_8_;
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         auVar16._0_8_;
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar15._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = center->m_data[0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = center->m_data[1] * center->m_data[1];
    auVar16 = vfmadd231sd_fma(auVar24,auVar22,auVar22);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *mass;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar30 + dVar36;
    auVar16 = vfnmadd132sd_fma(auVar16,auVar29,auVar8);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar16._0_8_;
  }
  return;
}

Assistant:

void ChTriangleMeshConnected::ComputeMassProperties(bool bodyCoords,
                                                    double& mass,
                                                    ChVector<>& center,
                                                    ChMatrix33<>& inertia) {
    const double oneDiv6 = (double)(1.0 / 6.0);
    const double oneDiv24 = (double)(1.0 / 24.0);
    const double oneDiv60 = (double)(1.0 / 60.0);
    const double oneDiv120 = (double)(1.0 / 120.0);

    // order:  1, x, y, z, x^2, y^2, z^2, xy, yz, zx
    double integral[10] = {(double)0.0, (double)0.0, (double)0.0, (double)0.0, (double)0.0,
                           (double)0.0, (double)0.0, (double)0.0, (double)0.0, (double)0.0};

    for (int i = 0; i < this->getNumTriangles(); i++) {
        // Get vertices of triangle i.
        ChVector<double> v0 = this->m_vertices[m_face_v_indices[i].x()];
        ChVector<double> v1 = this->m_vertices[m_face_v_indices[i].y()];
        ChVector<double> v2 = this->m_vertices[m_face_v_indices[i].z()];

        // Get cross product of edges and normal vector.
        ChVector<double> V1mV0 = v1 - v0;
        ChVector<double> V2mV0 = v2 - v0;
        ChVector<double> N = Vcross(V1mV0, V2mV0);

        // Compute integral terms.
        double tmp0, tmp1, tmp2;
        double f1x, f2x, f3x, g0x, g1x, g2x;
        tmp0 = v0.x() + v1.x();
        f1x = tmp0 + v2.x();
        tmp1 = v0.x() * v0.x();
        tmp2 = tmp1 + v1.x() * tmp0;
        f2x = tmp2 + v2.x() * f1x;
        f3x = v0.x() * tmp1 + v1.x() * tmp2 + v2.x() * f2x;
        g0x = f2x + v0.x() * (f1x + v0.x());
        g1x = f2x + v1.x() * (f1x + v1.x());
        g2x = f2x + v2.x() * (f1x + v2.x());

        double f1y, f2y, f3y, g0y, g1y, g2y;
        tmp0 = v0.y() + v1.y();
        f1y = tmp0 + v2.y();
        tmp1 = v0.y() * v0.y();
        tmp2 = tmp1 + v1.y() * tmp0;
        f2y = tmp2 + v2.y() * f1y;
        f3y = v0.y() * tmp1 + v1.y() * tmp2 + v2.y() * f2y;
        g0y = f2y + v0.y() * (f1y + v0.y());
        g1y = f2y + v1.y() * (f1y + v1.y());
        g2y = f2y + v2.y() * (f1y + v2.y());

        double f1z, f2z, f3z, g0z, g1z, g2z;
        tmp0 = v0.z() + v1.z();
        f1z = tmp0 + v2.z();
        tmp1 = v0.z() * v0.z();
        tmp2 = tmp1 + v1.z() * tmp0;
        f2z = tmp2 + v2.z() * f1z;
        f3z = v0.z() * tmp1 + v1.z() * tmp2 + v2.z() * f2z;
        g0z = f2z + v0.z() * (f1z + v0.z());
        g1z = f2z + v1.z() * (f1z + v1.z());
        g2z = f2z + v2.z() * (f1z + v2.z());

        // Update integrals.
        integral[0] += N.x() * f1x;
        integral[1] += N.x() * f2x;
        integral[2] += N.y() * f2y;
        integral[3] += N.z() * f2z;
        integral[4] += N.x() * f3x;
        integral[5] += N.y() * f3y;
        integral[6] += N.z() * f3z;
        integral[7] += N.x() * (v0.y() * g0x + v1.y() * g1x + v2.y() * g2x);
        integral[8] += N.y() * (v0.z() * g0y + v1.z() * g1y + v2.z() * g2y);
        integral[9] += N.z() * (v0.x() * g0z + v1.x() * g1z + v2.x() * g2z);
    }

    integral[0] *= oneDiv6;
    integral[1] *= oneDiv24;
    integral[2] *= oneDiv24;
    integral[3] *= oneDiv24;
    integral[4] *= oneDiv60;
    integral[5] *= oneDiv60;
    integral[6] *= oneDiv60;
    integral[7] *= oneDiv120;
    integral[8] *= oneDiv120;
    integral[9] *= oneDiv120;

    // mass
    mass = integral[0];

    // center of mass
    center = ChVector<double>(integral[1], integral[2], integral[3]) / mass;

    // inertia relative to world origin
    inertia(0, 0) = integral[5] + integral[6];
    inertia(0, 1) = -integral[7];
    inertia(0, 2) = -integral[9];
    inertia(1, 0) = inertia(0, 1);
    inertia(1, 1) = integral[4] + integral[6];
    inertia(1, 2) = -integral[8];
    inertia(2, 0) = inertia(0, 2);
    inertia(2, 1) = inertia(1, 2);
    inertia(2, 2) = integral[4] + integral[5];

    // inertia relative to center of mass
    if (bodyCoords) {
        inertia(0, 0) -= mass * (center.y() * center.y() + center.z() * center.z());
        inertia(0, 1) += mass * center.x() * center.y();
        inertia(0, 2) += mass * center.z() * center.x();
        inertia(1, 0) = inertia(0, 1);
        inertia(1, 1) -= mass * (center.z() * center.z() + center.x() * center.x());
        inertia(1, 2) += mass * center.y() * center.z();
        inertia(2, 0) = inertia(0, 2);
        inertia(2, 1) = inertia(1, 2);
        inertia(2, 2) -= mass * (center.x() * center.x() + center.y() * center.y());
    }
}